

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O0

int __thiscall xercesc_4_0::DOMAttrImpl::rename(DOMAttrImpl *this,char *__old,char *__new)

{
  DOMDocument *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *pXVar4;
  DOMNodeImpl *pDVar5;
  undefined4 extraout_var_00;
  DOMNodeImpl *n2;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMDocumentImpl *local_60;
  long local_48;
  DOMNode *child;
  DOMAttr *newAttr;
  DOMDocumentImpl *doc;
  DOMElement *el;
  XMLCh *name_local;
  XMLCh *namespaceURI_local;
  DOMAttrImpl *this_local;
  long *plVar3;
  
  iVar2 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x2c])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  pDVar1 = (this->fParent).fOwnerDocument;
  if (pDVar1 == (DOMDocument *)0x0) {
    local_60 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_60 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x170))(plVar3,this);
  }
  if ((__old == (char *)0x0) || (*(short *)__old == 0)) {
    pXVar4 = DOMDocumentImpl::getPooledString(local_60,(XMLCh *)__new);
    this->fName = pXVar4;
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x168))(plVar3,this);
    }
    pDVar5 = xercesc_4_0::castToNodeImpl((DOMNode *)this);
    DOMNodeImpl::callUserDataHandlers(pDVar5,NODE_RENAMED,(DOMNode *)this,(DOMNode *)this);
    this_local = this;
  }
  else {
    iVar2 = (*(local_60->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])(local_60,__old,__new)
    ;
    this_local = (DOMAttrImpl *)CONCAT44(extraout_var_00,iVar2);
    pDVar5 = xercesc_4_0::castToNodeImpl((DOMNode *)this);
    n2 = xercesc_4_0::castToNodeImpl((DOMNode *)this_local);
    DOMDocumentImpl::transferUserData(local_60,pDVar5,n2);
    iVar2 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[7])();
    local_48 = CONCAT44(extraout_var_01,iVar2);
    while (local_48 != 0) {
      (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x10])(this,local_48);
      (*(this_local->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x11])(this_local,local_48);
      iVar2 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[7])();
      local_48 = CONCAT44(extraout_var_02,iVar2);
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x1a0))(plVar3,this_local);
    }
    pDVar5 = xercesc_4_0::castToNodeImpl((DOMNode *)this_local);
    DOMNodeImpl::callUserDataHandlers(pDVar5,NODE_RENAMED,(DOMNode *)this,(DOMNode *)this_local);
  }
  return (int)this_local;
}

Assistant:

DOMNode* DOMAttrImpl::rename(const XMLCh* namespaceURI, const XMLCh* name)
{
    DOMElement* el = getOwnerElement();
    DOMDocumentImpl* doc = (DOMDocumentImpl*)fParent.fOwnerDocument;

    if (el)
        el->removeAttributeNode(this);

    if (!namespaceURI || !*namespaceURI) {
        fName = doc->getPooledString(name);

        if (el)
            el->setAttributeNode(this);

        // and fire user data NODE_RENAMED event
        castToNodeImpl(this)->callUserDataHandlers(DOMUserDataHandler::NODE_RENAMED, this, this);

        return this;
    }
    else {

        // create a new AttrNS
        DOMAttr* newAttr = doc->createAttributeNS(namespaceURI, name);

        // transfer the userData
        doc->transferUserData(castToNodeImpl(this), castToNodeImpl(newAttr));

        // move children to new node
        DOMNode* child = getFirstChild();
        while (child) {
            removeChild(child);
            newAttr->appendChild(child);
            child = getFirstChild();
        }

        // reattach attr to element
        if (el)
            el->setAttributeNodeNS(newAttr);

        // and fire user data NODE_RENAMED event
        castToNodeImpl(newAttr)->callUserDataHandlers(DOMUserDataHandler::NODE_RENAMED, this, newAttr);

        return newAttr;
    }
}